

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::makeARCopy(KktCheck *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  allocator_type local_45;
  value_type local_44;
  vector<int,_std::allocator<int>_> iwork;
  
  this->tol = 1e-05;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&iwork,(long)this->numRow,&local_44,&local_45);
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->ARstart,(long)this->numRow + 1,&local_44);
  iVar9 = (int)((ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,(long)iVar9);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,(long)iVar9);
  piVar1 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = 0;
  while (this->k = iVar8, iVar8 < iVar9) {
    iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [piVar1[iVar8]] =
         iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[piVar1[iVar8]] + 1;
    iVar8 = this->k + 1;
  }
  piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = 1;
  while( true ) {
    this->i = iVar8;
    iVar9 = this->numRow;
    if (iVar9 < iVar8) break;
    piVar1[iVar8] =
         iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[(long)iVar8 + -1] + piVar1[(long)iVar8 + -1];
    iVar8 = this->i + 1;
  }
  piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = 0;
  while (this->i = iVar8, iVar8 < iVar9) {
    iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar8] = piVar1[iVar8];
    iVar9 = this->numRow;
    iVar8 = this->i + 1;
  }
  piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  while (lVar7 = lVar6, lVar7 < this->numCol) {
    piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (iVar8 = piVar1[lVar7]; this->k = iVar8, lVar6 = lVar7 + 1, iVar8 < piVar1[lVar7 + 1];
        iVar8 = iVar8 + 1) {
      iVar8 = piVar2[iVar8];
      iVar9 = iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar8];
      iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar8] = iVar9 + 1;
      piVar4[iVar9] = (int)lVar7;
      iVar8 = this->k;
      pdVar5[iVar9] = pdVar3[iVar8];
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&iwork.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void KktCheck::makeARCopy() {
	tol = 0.00001;
	// Make a AR copy
	vector<int> iwork(numRow, 0);
	ARstart.resize(numRow + 1, 0);
	int AcountX = Aindex.size();
	ARindex.resize(AcountX);
	ARvalue.resize(AcountX);
	for (k = 0; k < AcountX; k++)
	    iwork[Aindex[k]]++;
	for (i = 1; i <= numRow; i++)
	    ARstart[i] = ARstart[i - 1] + iwork[i - 1];
	for (i = 0; i < numRow; i++)
	    iwork[i] = ARstart[i];
	for (int iCol = 0; iCol < numCol; iCol++) {
	    for (k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	        int iRow = Aindex[k];
	        int iPut = iwork[iRow]++;
	        ARindex[iPut] = iCol;
	        ARvalue[iPut] = Avalue[k];
	    }
	}
}